

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

char * QtPrivate::QTypeNormalizer::skipTemplate(char *x,char *e,bool stopAtComa)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  char delim;
  
  if (x == e) {
    return x;
  }
  iVar2 = 0;
  iVar4 = 0;
  do {
    bVar1 = *x;
    if (0x3b < bVar1) {
      if (0x5c < bVar1) {
        if (bVar1 != 0x5d) {
          if (bVar1 == 0x7b) goto switchD_001237b5_caseD_28;
          if (bVar1 != 0x7d) goto switchD_001237b5_caseD_23;
        }
        goto switchD_001237b5_caseD_29;
      }
      if (bVar1 == 0x3c) {
        iVar2 = iVar2 + (uint)(iVar4 == 0);
      }
      else if (bVar1 == 0x3e) {
        if (iVar4 == 0) {
          if (iVar2 < 1) {
            return (char *)(byte *)x;
          }
          iVar2 = iVar2 + -1;
          iVar4 = 0;
        }
      }
      else if (bVar1 == 0x5b) goto switchD_001237b5_caseD_28;
      goto switchD_001237b5_caseD_23;
    }
    switch(bVar1) {
    case 0x22:
      goto switchD_001237b5_caseD_22;
    case 0x27:
      if ((byte)(((byte *)x)[-1] - 0x30) < 10) break;
      goto switchD_001237b5_caseD_22;
    case 0x28:
switchD_001237b5_caseD_28:
      iVar4 = iVar4 + 1;
      break;
    case 0x29:
switchD_001237b5_caseD_29:
      iVar4 = iVar4 + -1;
      break;
    case 0x2c:
      if ((iVar4 == 0 && stopAtComa) && (iVar2 == 0)) {
        return (char *)(byte *)x;
      }
    }
switchD_001237b5_caseD_23:
    x = (char *)((byte *)x + 1);
joined_r0x00123861:
    if (x == e) {
      return (char *)(byte *)x;
    }
  } while( true );
switchD_001237b5_caseD_22:
  while (pbVar3 = (byte *)x, x = (char *)(pbVar3 + 1), x != e) {
    if (pbVar3[1] == bVar1) {
      x = (char *)(pbVar3 + 2);
      break;
    }
    if ((pbVar3[1] == 0x5c) && (x = (char *)(pbVar3 + 2), pbVar3 + 2 == (byte *)e)) {
      return e;
    }
  }
  goto joined_r0x00123861;
}

Assistant:

static constexpr const char *skipTemplate(const char *x, const char *e, bool stopAtComa = false)
    {
        int scopeDepth = 0;
        int templateDepth = 0;
        while (x != e) {
            switch (*x) {
            case '<':
                if (!scopeDepth)
                    templateDepth++;
                break;
            case ',':
                if (stopAtComa && !scopeDepth && !templateDepth)
                    return x;
                break;
            case '>':
                if (!scopeDepth)
                    if (--templateDepth < 0)
                        return x;
                break;
            case '(':
            case '[':
            case '{':
                scopeDepth++;
                break;
            case '}':
            case ']':
            case ')':
                scopeDepth--;
                break;
            case '\'':
                if (is_number(x[-1]))
                    break;
                Q_FALLTHROUGH();
            case '\"':
                x = skipString(x, e);
                continue;
            }
            x++;
        }
        return x;
    }